

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_version_details.c
# Opt level: O2

char * archive_mbedtls_version(void)

{
  return (char *)0x0;
}

Assistant:

const char *
archive_mbedtls_version(void)
{
#if defined(ARCHIVE_CRYPTOR_USE_MBED) || defined(ARCHIVE_CRYPTO_MBED)
	static char mbed_version[9];
	mbedtls_version_get_string(mbed_version);
	return mbed_version;
#else
	return NULL;
#endif
}